

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_range.cpp
# Opt level: O0

char32_t dpfb::cp_range::parseCp(char **str)

{
  int iVar1;
  CpRangeError *this;
  string local_40 [35];
  char local_1d;
  char32_t local_1c;
  int iStack_18;
  char c;
  char32_t result;
  char *end;
  char **str_local;
  
  end = (char *)str;
  local_1c = unicode::strToCp(*str,(char **)&stack0xffffffffffffffe8);
  if (_iStack_18 == *(char **)end) {
    _iStack_18 = *(char **)end;
    while (((local_1d = *_iStack_18, local_1d != '\0' && (local_1d != ',')) &&
           (iVar1 = isspace((int)local_1d), iVar1 == 0))) {
      _iStack_18 = _iStack_18 + 1;
    }
    this = (CpRangeError *)__cxa_allocate_exception(0x10);
    dpfb::str::format_abi_cxx11_
              ((char *)local_40,"Invalid code point specifier \"%.*s\"",
               (ulong)(uint)(iStack_18 - (int)*(undefined8 *)end));
    CpRangeError::runtime_error(this,local_40);
    __cxa_throw(this,&CpRangeError::typeinfo,CpRangeError::~CpRangeError);
  }
  *(char **)end = _iStack_18;
  return local_1c;
}

Assistant:

static char32_t parseCp(const char*& str)
{
    const char* end;
    const auto result = unicode::strToCp(str, &end);
    if (end == str) {
        // Find a meaningful end of the invalid code point.
        end = str;
        while (const auto c = *end) {
            if (c == cpRangeSeparator || std::isspace(c))
                break;
            ++end;
        }

        throw CpRangeError(
            str::format(
                "Invalid code point specifier \"%.*s\"",
                static_cast<int>(end - str), str));
    }

    str = end;

    return result;
}